

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O1

void __thiscall chrono::ChTimestepperLeapfrog::~ChTimestepperLeapfrog(ChTimestepperLeapfrog *this)

{
  double *pdVar1;
  
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperLeapfrog_00b6b390;
  pdVar1 = (this->Aold).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  ChTimestepperIIorder::~ChTimestepperIIorder(&this->super_ChTimestepperIIorder);
  operator_delete(this,0x98);
  return;
}

Assistant:

class ChApi ChTimestepperLeapfrog : public ChTimestepperIIorder {
  protected:
    ChStateDelta Aold;

  public:
    /// Constructors (default empty)
    ChTimestepperLeapfrog(ChIntegrableIIorder* intgr = nullptr) : ChTimestepperIIorder(intgr) {}

    virtual Type GetType() const override { return Type::LEAPFROG; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}